

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::getFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  int iVar1;
  element_type *this_00;
  OneHotEncoder *this_01;
  StringVector *pSVar2;
  string *__x;
  int local_2c;
  int i;
  OneHotEncoder *ohe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *container_local;
  OneHotEncoder *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_onehotencoder(this_00);
  local_2c = 0;
  while( true ) {
    pSVar2 = Specification::OneHotEncoder::stringcategories(this_01);
    iVar1 = Specification::StringVector::vector_size(pSVar2);
    if (iVar1 <= local_2c) break;
    pSVar2 = Specification::OneHotEncoder::stringcategories(this_01);
    __x = Specification::StringVector::vector_abi_cxx11_(pSVar2,local_2c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(container,__x);
    local_2c = local_2c + 1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getFeatureEncoding(std::vector<std::string>& container) {
        auto *ohe = m_spec->mutable_onehotencoder();
        
        for (int i = 0; i < ohe->stringcategories().vector_size(); i++) {
            container.push_back(ohe->stringcategories().vector(i));
        }
        return Result();
    }